

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bassigncstr(bstring a,char *str)

{
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  size_t len;
  int i;
  char *str_local;
  bstring a_local;
  
  if ((((a != (bstring)0x0) && (a->data != (uchar *)0x0)) && (a->slen <= a->mlen)) &&
     (((-1 < a->slen && (a->mlen != 0)) && (str != (char *)0x0)))) {
    for (len._4_4_ = 0; len._4_4_ < a->mlen; len._4_4_ = len._4_4_ + 1) {
      uVar1 = str[len._4_4_];
      a->data[len._4_4_] = uVar1;
      if (uVar1 == '\0') {
        a->slen = len._4_4_;
        return 0;
      }
    }
    a->slen = len._4_4_;
    sVar3 = strlen(str + len._4_4_);
    if (sVar3 + 1 <= 0x7fffffffU - (long)len._4_4_) {
      iVar2 = balloc(a,len._4_4_ + (int)sVar3 + 1);
      if (-1 < iVar2) {
        if (sVar3 != 0xffffffffffffffff) {
          memmove(a->data + len._4_4_,str + len._4_4_,sVar3 + 1);
        }
        a->slen = (int)sVar3 + a->slen;
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int bassigncstr (bstring a, const char * str) {
int i;
size_t len;
	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0 || NULL == str)
		return BSTR_ERR;

	for (i=0; i < a->mlen; i++) {
		if ('\0' == (a->data[i] = str[i])) {
			a->slen = i;
			return BSTR_OK;
		}
	}

	a->slen = i;
	len = strlen (str + i);
	if (len + 1 > (size_t) INT_MAX - i ||
	    0 > balloc (a, (int) (i + len + 1))) return BSTR_ERR;
	bBlockCopy (a->data + i, str + i, (size_t) len + 1);
	a->slen += (int) len;
	return BSTR_OK;
}